

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O2

err_t cmdFileDup(char *oname,char *iname,size_t skip,size_t count)

{
  bool_t bVar1;
  err_t eVar2;
  bool_t bVar3;
  file_t file;
  file_t file_00;
  blob_t buf;
  size_t sVar4;
  size_t count_local;
  size_t c;
  
  count_local = count;
  file = fileOpen(iname,"rb");
  eVar2 = 0xcb;
  if (file != (file_t)0x0) {
    bVar1 = fileSeek(file,skip,0);
    if (bVar1 == 0) {
      fileClose(file);
      eVar2 = 0xcf;
    }
    else {
      file_00 = fileOpen(oname,"wb");
      eVar2 = 0xcb;
      if (file_00 != (file_t)0x0) {
        buf = blobCreate(0x1000);
        if (buf == (blob_t)0x0) {
          fileClose(file_00);
          fileClose(file);
          return 0x6e;
        }
        eVar2 = 0;
        if (count == 0xffffffffffffffff) {
          sVar4 = 0xffffffffffffffff;
          while ((sVar4 != 0 && (eVar2 == 0))) {
            count_local = fileRead2(buf,0x1000,file);
            eVar2 = 0xcf;
            sVar4 = 0xffffffffffffffff;
            if (count_local != 0xffffffffffffffff) {
              eVar2 = fileWrite(&count_local,buf,count_local,file_00);
              sVar4 = count_local;
            }
          }
        }
        else {
          while ((count != 0 && (eVar2 == 0))) {
            c = 0x1000;
            if (count < 0x1000) {
              c = count;
            }
            sVar4 = fileRead2(buf,c,file);
            eVar2 = 0xcf;
            if (sVar4 == c) {
              eVar2 = fileWrite(&c,buf,sVar4,file_00);
            }
            count = count - c;
            count_local = count;
          }
        }
        blobClose(buf);
        bVar1 = fileClose(file_00);
        if (eVar2 == 0) {
          bVar3 = fileClose(file);
          if (bVar1 == 0) {
            return 0x67;
          }
          if (bVar3 == 0) {
            return 0x67;
          }
          return 0;
        }
      }
      fileClose(file);
    }
  }
  return eVar2;
}

Assistant:

err_t cmdFileDup(const char* oname, const char* iname, size_t skip,
	size_t count)
{
	const size_t buf_size = 4096;
	err_t code;
	file_t ifile;
	file_t ofile;
	void* buf;
	// pre
	ASSERT(strIsValid(iname) && strIsValid(oname));
	// открыть входной файл
	code = cmdFileOpen(ifile, iname, "rb");
	ERR_CALL_CHECK(code);
	// пропустить skip октетов
	if (!fileSeek(ifile, skip, SEEK_SET))
	{
		cmdFileClose(ifile);
		return ERR_FILE_READ;
	}
	// открыть выходной файл
	code = cmdFileOpen(ofile, oname, "wb");
	ERR_CALL_HANDLE(code, cmdFileClose(ifile));
	// подготовить память
	code = cmdBlobCreate(buf, buf_size);
	ERR_CALL_HANDLE(code, (cmdFileClose(ofile), cmdFileClose(ifile)));
	// дублировать count октетов
	if (count != SIZE_MAX)
		while (count && code == ERR_OK)
		{
			size_t c = MIN2(buf_size, count);
			if (fileRead2(buf, c, ifile) != c)
				code = ERR_FILE_READ;
			else
				code = fileWrite(&c, buf, c, ofile);
			count -= c;
		}
	// дублировать все
	else
		while (count && code == ERR_OK)
		{
			count = fileRead2(buf, buf_size, ifile);
			if (count == SIZE_MAX)
				code = ERR_FILE_READ;
			else 
				code = fileWrite(&count, buf, count, ofile);
		}
	// завершить
	cmdBlobClose(buf);
	ERR_CALL_HANDLE(code, (cmdFileClose(ofile), cmdFileClose(ifile)));
	code = cmdFileClose(ofile);
	ERR_CALL_HANDLE(code, cmdFileClose(ifile));
	return cmdFileClose(ifile);
}